

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::operator=
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *in_RSI;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *in_RDI;
  
  if (in_RDI != in_RSI) {
    ThreeAxisForceTorqueContactSensorPrivateAttributes::operator=(in_RSI,in_RDI);
  }
  return (ThreeAxisForceTorqueContactSensor *)in_RDI;
}

Assistant:

ThreeAxisForceTorqueContactSensor& ThreeAxisForceTorqueContactSensor::operator=(const ThreeAxisForceTorqueContactSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}